

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,vec4 val)

{
  pointer pGVar1;
  size_t __n;
  int iVar2;
  invalid_argument *piVar3;
  pointer pGVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  pGVar4 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar4 != pGVar1) {
    __n = name->_M_string_length;
    do {
      if ((pGVar4->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_00295f5b:
          if (pGVar4->type == Vector4Float) {
            pGVar4->isSet = true;
            return;
          }
          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar3,"Tried to set GLShaderUniform with wrong type");
          __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        iVar2 = bcmp((pGVar4->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
        if (iVar2 == 0) goto LAB_00295f5b;
      }
      pGVar4 = pGVar4 + 1;
    } while (pGVar4 != pGVar1);
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,"Tried to set nonexistent uniform with name ",name);
  std::invalid_argument::invalid_argument(piVar3,(string *)&bStack_48);
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, glm::vec4 val) {

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == RenderDataType::Vector4Float) {
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}